

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::ComputeTargetObjectDirectory
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratorTarget *gt)

{
  string *psVar1;
  string dir;
  char local_c1;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  local_50.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_50.View_._M_len = psVar1->_M_string_length;
  local_80.View_._M_str = local_80.Digits_;
  local_80.View_._M_len = 1;
  local_80.Digits_[0] = '/';
  (*gt->LocalGenerator->_vptr_cmLocalGenerator[0xe])(&local_a0,gt->LocalGenerator,gt);
  local_c1 = '/';
  cmStrCat<std::__cxx11::string,char>(&local_c0,&local_50,&local_80,&local_a0,&local_c1);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::_M_assign((string *)&gt->ObjectDirectory);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir =
    cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(), '/',
             gt->LocalGenerator->GetTargetDirectory(gt), '/');
  gt->ObjectDirectory = dir;
}